

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall
NEST::LArNEST::GetERElectronYields(LArNEST *this,double energy,double efield,double density)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = (this->fER).alpha.A;
  dVar2 = (this->fER).alpha.B;
  dVar3 = (this->fER).alpha.C;
  dVar4 = (this->fER).alpha.D;
  dVar5 = (this->fER).alpha.E;
  dVar9 = exp(density / (this->fER).alpha.F);
  dVar10 = pow(efield / (dVar9 * dVar5 + dVar4),(this->fER).alpha.G);
  dVar4 = (this->fER).beta.A;
  dVar5 = (this->fER).beta.B;
  dVar9 = (this->fER).beta.C;
  dVar11 = pow(efield / (this->fER).beta.D,(this->fER).beta.E);
  dVar9 = pow(dVar11 + dVar9,(this->fER).beta.F);
  dVar12 = (dVar9 * dVar5 + dVar4) * (dVar2 / (dVar10 + dVar3) + dVar1);
  dVar1 = (this->fER).gamma.B;
  dVar2 = this->fWorkQuantaFunction;
  dVar3 = (this->fER).gamma.A;
  dVar4 = (this->fER).gamma.C;
  dVar5 = (this->fER).gamma.D;
  dVar9 = (this->fER).gamma.E;
  dVar13 = pow(efield / (this->fER).gamma.F,(this->fER).gamma.G);
  dVar10 = (this->fER).doke_birks.A;
  dVar11 = (this->fER).doke_birks.B;
  dVar6 = (this->fER).doke_birks.C;
  dVar14 = pow(efield / (this->fER).doke_birks.D,(this->fER).doke_birks.E);
  dVar7 = (this->fER).p1;
  dVar8 = (this->fER).p2;
  dVar15 = pow(energy + 0.5,(this->fER).p3);
  dVar15 = pow(dVar15 * dVar8 + dVar7,(this->fER).p4);
  dVar7 = (this->fER).p5;
  dVar8 = (this->fER).delta;
  dVar16 = pow(energy,(this->fER).let);
  return dVar8 / (dVar16 * (dVar11 / (dVar14 + dVar6) + dVar10) + dVar7) +
         (((dVar9 / dVar13 + dVar5) * dVar4 + dVar1 / dVar2) * dVar3 - dVar12) / dVar15 + dVar12;
}

Assistant:

double LArNEST::GetERElectronYields(double energy, double efield,
                                    double density) {
  double alpha = GetERElectronYieldsAlpha(efield, density);
  double beta = GetERElectronYieldsBeta(efield);
  double gamma = GetERElectronYieldsGamma(efield);
  double doke_birks = GetERElectronYieldsDokeBirks(efield);
  return alpha * beta +
         (gamma - alpha * beta) /
             pow(fER.p1 + fER.p2 * pow(energy + 0.5, fER.p3), fER.p4) +
         fER.delta / (fER.p5 + doke_birks * pow(energy, fER.let));
}